

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FieldDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FieldDescriptorProto *pFVar2;
  string *psVar3;
  FieldDescriptorProto **v1;
  FieldDescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  FieldOptions *pFVar7;
  LogMessage local_108;
  Voidify local_f1;
  uint local_f0;
  uint32_t cached_has_bits;
  LogMessage local_e0;
  Voidify local_c9;
  FieldDescriptorProto *local_c8;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  FieldDescriptorProto *from;
  FieldDescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_88;
  string *local_80;
  FieldDescriptorProto *local_78;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_70;
  string *local_68;
  FieldDescriptorProto *local_60;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_58;
  string *local_50;
  FieldDescriptorProto *local_48;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_40;
  string *local_38;
  FieldDescriptorProto *local_30;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_28;
  string *local_20;
  FieldDescriptorProto *local_18;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_10;
  
  arena = (Arena *)from_msg;
  from = (FieldDescriptorProto *)to_msg;
  _this = (FieldDescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_c8 = (FieldDescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldDescriptorProto_const*>(&local_c8);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldDescriptorProto*>(&from);
  local_c0 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldDescriptorProto_const*,google::protobuf::FieldDescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_c0 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1677,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e0);
  }
  local_f0 = 0;
  puVar5 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pFVar2 = from;
  local_f0 = *puVar5;
  if ((local_f0 & 0xff) != 0) {
    if ((local_f0 & 1) != 0) {
      local_80 = _internal_name_abi_cxx11_((FieldDescriptorProto *)arena);
      local_78 = pFVar2;
      local_70 = &pFVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_80;
      *puVar5 = *puVar5 | 1;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.name_,psVar3,pAVar6);
    }
    pFVar2 = from;
    if ((local_f0 & 2) != 0) {
      local_68 = _internal_extendee_abi_cxx11_((FieldDescriptorProto *)arena);
      local_60 = pFVar2;
      local_58 = &pFVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_68;
      *puVar5 = *puVar5 | 2;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.extendee_,psVar3,pAVar6);
    }
    pFVar2 = from;
    if ((local_f0 & 4) != 0) {
      local_50 = _internal_type_name_abi_cxx11_((FieldDescriptorProto *)arena);
      local_48 = pFVar2;
      local_40 = &pFVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar5 = *puVar5 | 4;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.type_name_,psVar3,pAVar6);
    }
    pFVar2 = from;
    if ((local_f0 & 8) != 0) {
      local_38 = _internal_default_value_abi_cxx11_((FieldDescriptorProto *)arena);
      local_30 = pFVar2;
      local_28 = &pFVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar5 = *puVar5 | 8;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.default_value_,psVar3,pAVar6);
    }
    pFVar2 = from;
    if ((local_f0 & 0x10) != 0) {
      local_20 = _internal_json_name_abi_cxx11_((FieldDescriptorProto *)arena);
      local_18 = pFVar2;
      local_10 = &pFVar2->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar5 = *puVar5 | 0x10;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.json_name_,psVar3,pAVar6);
    }
    if ((local_f0 & 0x20) != 0) {
      if ((arena->impl_).first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x168d,"from._impl_.options_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_108);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f1,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_108);
      }
      if ((from->field_0)._impl_.options_ == (FieldOptions *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.prefetch_ptr_;
        local_88 = absl_log_internal_check_op_result;
        pFVar7 = (FieldOptions *)
                 Arena::CopyConstruct<google::protobuf::FieldOptions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pFVar7;
      }
      else {
        FieldOptions::MergeFrom
                  ((from->field_0)._impl_.options_,
                   (FieldOptions *)(arena->impl_).first_arena_.prefetch_ptr_);
      }
    }
    if ((local_f0 & 0x40) != 0) {
      (from->field_0)._impl_.number_ = *(int32_t *)&(arena->impl_).first_arena_.cleanup_list_.head_;
    }
    if ((local_f0 & 0x80) != 0) {
      (from->field_0)._impl_.oneof_index_ =
           *(int32_t *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 4);
    }
  }
  uVar1 = local_f0;
  if ((local_f0 & 0x700) != 0) {
    if ((local_f0 & 0x100) != 0) {
      (from->field_0)._impl_.proto3_optional_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.next_ & 1);
    }
    if ((local_f0 & 0x200) != 0) {
      (from->field_0)._impl_.label_ =
           *(int *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 4);
    }
    if ((local_f0 & 0x400) != 0) {
      (from->field_0)._impl_.type_ = *(int *)&(arena->impl_).first_arena_.cleanup_list_.limit_;
    }
  }
  puVar5 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar5 = uVar1 | *puVar5;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void FieldDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FieldDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_extendee(from._internal_extendee());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_type_name(from._internal_type_name());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_default_value(from._internal_default_value());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_json_name(from._internal_json_name());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_ = from._impl_.proto3_optional_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.label_ = from._impl_.label_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.type_ = from._impl_.type_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}